

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.h
# Opt level: O0

uint32_t leveldb::DecodeFixed32(char *ptr)

{
  uint32_t result;
  char *ptr_local;
  
  return *(uint32_t *)ptr;
}

Assistant:

inline uint32_t DecodeFixed32(const char *ptr) {
        if (port::kLittleEndian) {
            // Load the raw bytes
            uint32_t result;
            memcpy(&result, ptr, sizeof(result));  // gcc optimizes this to a plain load
            return result;
        } else {
            return ((static_cast<uint32_t>(static_cast<unsigned char>(ptr[0])))
                    | (static_cast<uint32_t>(static_cast<unsigned char>(ptr[1])) << 8)
                    | (static_cast<uint32_t>(static_cast<unsigned char>(ptr[2])) << 16)
                    | (static_cast<uint32_t>(static_cast<unsigned char>(ptr[3])) << 24));
        }
    }